

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void fmt::anon_unknown_1::format_error_code(Writer *out,int error_code,StringRef message)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  BasicWriter<char> *this;
  ulong uVar4;
  MainType abs_value;
  size_t error_code_size;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  BasicStringRef<char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar5;
  BasicStringRef<char> in_stack_ffffffffffffff98;
  long local_28;
  BasicStringRef<char> local_10;
  
  BasicWriter<char>::clear((BasicWriter<char> *)0x1cc2c0);
  local_28 = 8;
  bVar1 = internal::is_negative<int>(0);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
  if (bVar1) {
    local_28 = 9;
  }
  uVar2 = internal::count_digits(0);
  uVar4 = (ulong)uVar2;
  sVar3 = BasicStringRef<char>::size(&local_10);
  if (sVar3 <= 500 - (local_28 + uVar4)) {
    BasicWriter<char>::operator<<
              ((BasicWriter<char> *)CONCAT44(uVar5,uVar2),in_stack_ffffffffffffff98);
    BasicStringRef<char>::BasicStringRef
              (in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    BasicWriter<char>::operator<<
              ((BasicWriter<char> *)CONCAT44(uVar5,uVar2),in_stack_ffffffffffffff98);
  }
  BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this = BasicWriter<char>::operator<<
                   ((BasicWriter<char> *)CONCAT44(uVar5,uVar2),in_stack_ffffffffffffff98);
  BasicWriter<char>::operator<<(this,in_stack_ffffffffffffff6c);
  return;
}

Assistant:

void format_error_code(Writer &out, int error_code,
                       StringRef message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // INLINE_BUFFER_SIZE to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.clear();
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  typedef internal::IntTraits<int>::MainType MainType;
  MainType abs_value = static_cast<MainType>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::count_digits(abs_value);
  if (message.size() <= internal::INLINE_BUFFER_SIZE - error_code_size)
    out << message << SEP;
  out << ERROR_STR << error_code;
  assert(out.size() <= internal::INLINE_BUFFER_SIZE);
}